

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeComputeStateSens(void *cvode_mem,N_Vector *ycorS,N_Vector *yS)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int retval;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xe5b,"CVodeComputeStateSens",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    iVar1 = N_VLinearSumVectorArray
                      (0,*(undefined4 *)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0x288),in_RSI,
                       in_RDX);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int CVodeComputeStateSens(void* cvode_mem, N_Vector* ycorS, N_Vector* yS)
{
  int retval;
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  retval = N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[0], ONE,
                                   ycorS, yS);
  if (retval != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}